

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# function.c
# Opt level: O1

sysbvm_tuple_t
sysbvm_ordinaryFunction_apply
          (sysbvm_context_t *context,sysbvm_tuple_t function,size_t argumentCount,
          sysbvm_tuple_t *arguments,sysbvm_bitflags_t applicationFlags)

{
  ulong uVar1;
  uint uVar2;
  sysbvm_tuple_t sVar3;
  sysbvm_tuple_t right;
  anon_struct_8_1_3a3b9956 gcFrame;
  sysbvm_stackFrameGCRootsRecord_t argumentsRecord;
  sysbvm_function_t *local_80;
  sysbvm_stackFrameRecord_t local_78;
  undefined8 local_68;
  sysbvm_function_t **ppsStack_60;
  sysbvm_stackFrameRecord_t local_50;
  size_t local_40;
  sysbvm_tuple_t *local_38;
  
  if (*(long *)(function + 0x40) != 0) {
    if (*(long *)(function + 0x40) == 0x5f) {
      sVar3 = sysbvm_string_createWithCString
                        (context,"Applying function with cyclic pending lazy analysis process ");
      right = sysbvm_tuple_printString(context,*(sysbvm_tuple_t *)(function + 0x10));
      sVar3 = sysbvm_string_concat(context,sVar3,right);
      sysbvm_errorWithMessageTuple(sVar3);
    }
    local_78.previous = (sysbvm_stackFrameRecord_s *)0x0;
    local_78.type = SYSBVM_STACK_FRAME_RECORD_TYPE_GC_ROOTS;
    local_78._12_4_ = 0;
    local_68 = 1;
    local_80 = (sysbvm_function_t *)function;
    ppsStack_60 = &local_80;
    sysbvm_stackFrame_pushRecord(&local_78);
    local_50.previous = (sysbvm_stackFrameRecord_s *)0x0;
    local_50.type = SYSBVM_STACK_FRAME_RECORD_TYPE_GC_ROOTS;
    local_40 = argumentCount;
    local_38 = arguments;
    sysbvm_stackFrame_pushRecord(&local_50);
    sysbvm_function_ensureAnalysis(context,&local_80);
    function = (sysbvm_tuple_t)local_80;
    sysbvm_stackFrame_popRecord(&local_50);
    sysbvm_stackFrame_popRecord(&local_78);
  }
  if ((function & 0xf) == 0 && (sysbvm_function_t *)function != (sysbvm_function_t *)0x0) {
    uVar1 = (((sysbvm_function_t *)function)->super).header.field_0.typePointer;
    if (((uVar1 & 0xf) == 0 && uVar1 != 0) && ((*(byte *)(uVar1 + 8) & 0x80) == 0)) {
      uVar1 = *(ulong *)(uVar1 + 0x70);
      if (uVar1 == 0 || (uVar1 & 0xf) != 0) {
        uVar2 = (uint)((long)uVar1 >> 4);
      }
      else {
        uVar2 = (uint)*(undefined8 *)(uVar1 + 0x10);
      }
    }
    else {
      uVar2 = 0;
    }
    if ((uVar2 >> 0xc & 1) != 0) {
      uVar1 = ((sysbvm_function_t *)function)->flags;
      if (uVar1 == 0 || (uVar1 & 0xf) != 0) {
        uVar2 = (uint)((long)uVar1 >> 4);
      }
      else {
        uVar2 = (uint)*(undefined8 *)(uVar1 + 0x10);
      }
      goto LAB_0011c62e;
    }
  }
  uVar2 = 0;
LAB_0011c62e:
  if ((uVar2 >> 9 & 1) == 0) {
    sVar3 = sysbvm_ordinaryFunction_directApply
                      (context,function,argumentCount,arguments,applicationFlags);
  }
  else {
    sVar3 = sysbvm_ordinaryFunction_memoizedApply
                      (context,function,argumentCount,arguments,applicationFlags);
  }
  return sVar3;
}

Assistant:

SYSBVM_API sysbvm_tuple_t sysbvm_ordinaryFunction_apply(sysbvm_context_t *context, sysbvm_tuple_t function, size_t argumentCount, sysbvm_tuple_t *arguments, sysbvm_bitflags_t applicationFlags)
{
    // Make sure the closure with lazy analysis is done and reified.
    sysbvm_function_t* functionObject = (sysbvm_function_t*)function;
    if(functionObject->captureEnvironment)
    {
        if(functionObject->captureEnvironment == SYSBVM_PENDING_MEMOIZATION_VALUE)
        {
            sysbvm_tuple_t errorTuple = sysbvm_string_concat(context,
                sysbvm_string_createWithCString(context, "Applying function with cyclic pending lazy analysis process "),
                sysbvm_tuple_printString(context, functionObject->super.name)
            );
            sysbvm_errorWithMessageTuple(errorTuple);
        }

        struct {
            sysbvm_tuple_t function;
        } gcFrame = {
            .function = function
        };
        SYSBVM_STACKFRAME_PUSH_GC_ROOTS(gcFrameRecord, gcFrame);

        sysbvm_stackFrameGCRootsRecord_t argumentsRecord = {
            .type = SYSBVM_STACK_FRAME_RECORD_TYPE_GC_ROOTS,
            .rootCount = argumentCount,
            .roots = arguments
        };
        sysbvm_stackFrame_pushRecord((sysbvm_stackFrameRecord_t*)&argumentsRecord);

        sysbvm_function_ensureAnalysis(context, (sysbvm_function_t**)&gcFrame.function);

        function = gcFrame.function;
        sysbvm_stackFrame_popRecord((sysbvm_stackFrameRecord_t*)&argumentsRecord);
        SYSBVM_STACKFRAME_POP_GC_ROOTS(gcFrameRecord);
    }

    if(sysbvm_function_isMemoized(context, function))
        return sysbvm_ordinaryFunction_memoizedApply(context, function, argumentCount, arguments, applicationFlags);
    return sysbvm_ordinaryFunction_directApply(context, function, argumentCount, arguments, applicationFlags);
}